

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O0

void __thiscall FIX::FieldMap::addGroupPtr(FieldMap *this,int field,FieldMap *group,bool setCount)

{
  int field_00;
  size_type sVar1;
  FieldBase local_90;
  vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_> *local_30;
  vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_> *vec;
  FieldMap *pFStack_20;
  bool setCount_local;
  FieldMap *group_local;
  FieldMap *pFStack_10;
  int field_local;
  FieldMap *this_local;
  
  if (group != (FieldMap *)0x0) {
    vec._7_1_ = setCount;
    pFStack_20 = group;
    group_local._4_4_ = field;
    pFStack_10 = this;
    local_30 = std::
               map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
               ::operator[](&this->m_groups,(key_type *)((long)&group_local + 4));
    std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::push_back
              (local_30,&stack0xffffffffffffffe0);
    field_00 = group_local._4_4_;
    if ((vec._7_1_ & 1) != 0) {
      sVar1 = std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::size(local_30);
      IntField::IntField((IntField *)&local_90,field_00,(int)sVar1);
      setField(this,&local_90,true);
      IntField::~IntField((IntField *)&local_90);
    }
  }
  return;
}

Assistant:

void FieldMap::addGroupPtr( int field, FieldMap * group, bool setCount )
{
    if( group == 0 )
        return;

    std::vector< FieldMap* >& vec = m_groups[ field ];
    vec.push_back( group );

    if( setCount )
        setField( IntField( field, (int)vec.size() ) );
}